

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void kratos::InlineGeneratorVisitor::optimize_passthrough_assignment
               (Generator *gen,
               vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
               *stmts)

{
  pointer pPVar1;
  Var *pVVar2;
  long lVar3;
  Var *var;
  int iVar4;
  Var **ppVVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PortInfo *info;
  pointer pPVar6;
  __node_base_ptr p_Var7;
  Var **__args;
  size_type *psVar8;
  undefined1 local_e0 [8];
  RenameLinkedVar v;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
  var_mapping;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> vars;
  Var *local_38;
  Var *right;
  
  Generator::set_use_stmt_remove_cache(gen,true);
  v.var_mapping_ =
       (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
        *)&var_mapping._M_h._M_rehash_policy._M_next_resize;
  var_mapping._M_h._M_buckets = (__buckets_ptr)0x1;
  psVar8 = &var_mapping._M_h._M_bucket_count;
  var_mapping._M_h._M_bucket_count = 0;
  var_mapping._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  var_mapping._M_h._M_element_count._0_4_ = 0x3f800000;
  var_mapping._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  var_mapping._M_h._M_rehash_policy._4_4_ = 0;
  var_mapping._M_h._M_rehash_policy._M_next_resize = 0;
  var_mapping._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pPVar1 = (stmts->
           super__Vector_base<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar6 = (stmts->
                super__Vector_base<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
                )._M_impl.super__Vector_impl_data._M_start; pPVar6 != pPVar1; pPVar6 = pPVar6 + 1) {
    local_e0 = (undefined1  [8])pPVar6->stmt->left_;
    local_38 = pPVar6->stmt->right_;
    if (pPVar6->direction == In) {
      Var::move_sink_to((Var *)local_e0,local_38,gen,false);
      (*((IRNode *)local_e0)->_vptr_IRNode[0x12])(local_e0,1);
      __args = &local_38;
      std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Var*&>
                ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)
                 &var_mapping._M_h._M_single_bucket,__args);
      ppVVar5 = (Var **)local_e0;
    }
    else {
      Var::move_src_to(local_38,(Var *)local_e0,gen,false);
      (*(local_38->super_IRNode)._vptr_IRNode[0x11])(local_38,1);
      __args = (Var **)local_e0;
      std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Var*&>
                ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)
                 &var_mapping._M_h._M_single_bucket,__args);
      ppVVar5 = &local_38;
    }
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Var*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string&,kratos::Var*&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Var*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&v.var_mapping_,&(*ppVVar5)->name,__args);
  }
  v.super_IRVisitor._8_8_ = &v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  v.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  v.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  v.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  v.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  v.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  v.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_e0 = (undefined1  [8])&PTR_visit_root_002b9fd8;
  v.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)&v.var_mapping_;
  IRVisitor::visit_content_s((IRVisitor *)local_e0,gen);
  while (psVar8 = (size_type *)*psVar8, p_Var7 = var_mapping._M_h._M_single_bucket,
        psVar8 != (size_type *)0x0) {
    Generator::remove_var(gen,(string *)(psVar8 + 1));
  }
  for (; p_Var7 != (__node_base_ptr)0x0; p_Var7 = p_Var7 + 1) {
    pVVar2 = (Var *)p_Var7->_M_nxt;
    iVar4 = (*(pVVar2->super_IRNode)._vptr_IRNode[0x10])(pVVar2);
    if (*(long *)(CONCAT44(extraout_var,iVar4) + 0x18) == 1) {
      iVar4 = (*(pVVar2->super_IRNode)._vptr_IRNode[0x10])(pVVar2);
      lVar3 = *(long *)(*(long *)(CONCAT44(extraout_var_00,iVar4) + 0x10) + 8);
      var = *(Var **)(lVar3 + 0xc0);
      if ((var == pVVar2) && (pVVar2 = *(Var **)(lVar3 + 200), (pVVar2->type_ & ~PortIO) == Base)) {
        Var::move_sink_to(var,pVVar2,gen,false);
        (*(var->super_IRNode)._vptr_IRNode[0x12])(var,1);
        Generator::remove_var(gen,&var->name);
      }
    }
  }
  Generator::clear_remove_stmt_cache(gen);
  Generator::set_use_stmt_remove_cache(gen,false);
  IRVisitor::~IRVisitor((IRVisitor *)local_e0);
  std::_Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>::~_Vector_base
            ((_Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)
             &var_mapping._M_h._M_single_bucket);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&v.var_mapping_);
  return;
}

Assistant:

static void optimize_passthrough_assignment(Generator* gen,
                                                const std::vector<PortInfo>& stmts) {
        gen->set_use_stmt_remove_cache(true);
        std::unordered_map<std::string, Var*> var_mapping;
        std::vector<Var*> vars;
        for (auto const& info : stmts) {
            auto* stmt = info.stmt;
            auto* left = stmt->left();
            auto* right = stmt->right();
            if (info.direction == PortDirection::In) {
                // move to right
                Var::move_sink_to(left, right, gen, false);
                left->clear_sources(true);
                vars.emplace_back(right);
                var_mapping.emplace(left->name, right);
            } else {
                // move to left
                Var::move_src_to(right, left, gen, false);
                right->clear_sinks(true);
                vars.emplace_back(left);
                var_mapping.emplace(right->name, left);
            }
        }

        // rename some constructs that's not assignments
        RenameLinkedVar v(var_mapping);
        v.visit_content_s(gen);
        // now remove them
        for (auto const& iter : var_mapping) {
            gen->remove_var(iter.first);
        }

        // also clear out variables with only one source
        // notice that we keep track of the ones need to check for performance reason
        for (auto* var : vars) {
            if (var->sources().size() != 1) {
                continue;
            }

            auto const& src_stmt = *var->sources().begin();
            auto* left = src_stmt->left();
            auto* right = src_stmt->right();
            if (left != var) continue;
            if (right->type() == VarType::PortIO || right->type() == VarType::Base) {
                // move
                VarSlice::move_sink_to(left, right, gen, false);
                left->clear_sources(true);
                gen->remove_var(left->name);
            }
        }

        gen->clear_remove_stmt_cache();
        gen->set_use_stmt_remove_cache(false);
    }